

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QGraphicsItem::setAcceptTouchEvents(QGraphicsItem *this,bool enabled)

{
  uint uVar1;
  QGraphicsItemPrivate *pQVar2;
  ulong uVar3;
  QGraphicsScene *pQVar4;
  long lVar5;
  ulong uVar6;
  
  pQVar2 = (this->d_ptr).d;
  uVar3 = *(ulong *)&pQVar2->field_0x160;
  if (((uVar3 >> 0x3b & 1) == 0) == enabled) {
    uVar6 = 0;
    if (enabled) {
      uVar6 = 0x800000000000000;
    }
    *(ulong *)&pQVar2->field_0x160 = uVar3 & 0xf7ffffffffffffff | uVar6;
    pQVar2 = (this->d_ptr).d;
    if (((*(ulong *)&pQVar2->field_0x160 & 0x800000000000000) != 0) &&
       (pQVar4 = pQVar2->scene, pQVar4 != (QGraphicsScene *)0x0)) {
      lVar5 = *(long *)&pQVar4->field_0x8;
      uVar1 = *(uint *)(lVar5 + 0xb8);
      if ((uVar1 >> 0x10 & 1) != 0) {
        *(uint *)(lVar5 + 0xb8) = uVar1 & 0xfffeffff;
        QGraphicsScenePrivate::enableTouchEventsOnViews
                  (*(QGraphicsScenePrivate **)&((this->d_ptr).d)->scene->field_0x8);
        return;
      }
    }
  }
  return;
}

Assistant:

T *operator->() const noexcept
    {
        return d;
    }